

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IntegerVectorExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerVectorExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  IntegerVectorExpressionSyntax *pIVar16;
  
  pIVar16 = (IntegerVectorExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((IntegerVectorExpressionSyntax *)this->endPtr < pIVar16 + 1) {
    pIVar16 = (IntegerVectorExpressionSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pIVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pIVar16->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       IntegerVectorExpression;
  (pIVar16->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pIVar16->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pIVar16->size).kind = TVar4;
  (pIVar16->size).field_0x2 = uVar5;
  (pIVar16->size).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar16->size).rawLen = uVar7;
  (pIVar16->size).info = pIVar1;
  (pIVar16->base).kind = TVar8;
  (pIVar16->base).field_0x2 = uVar9;
  (pIVar16->base).numFlags = (NumericTokenFlags)NVar10.raw;
  (pIVar16->base).rawLen = uVar11;
  (pIVar16->base).info = pIVar2;
  (pIVar16->value).kind = TVar12;
  (pIVar16->value).field_0x2 = uVar13;
  (pIVar16->value).numFlags = (NumericTokenFlags)NVar14.raw;
  (pIVar16->value).rawLen = uVar15;
  (pIVar16->value).info = pIVar3;
  return pIVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }